

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ConvertUTF.c
# Opt level: O2

Boolean isLegalUTF8(UTF8 *source,int length)

{
  byte bVar1;
  byte bVar2;
  UTF8 *pUVar3;
  
  if (3 < length - 1U) {
    return '\0';
  }
  pUVar3 = source + length;
  switch(length) {
  case 1:
    bVar2 = *source;
    goto LAB_008563e6;
  case 2:
    goto switchD_008563e2_caseD_2;
  case 4:
    if (-0x41 < (char)pUVar3[-1]) {
      return '\0';
    }
    pUVar3 = pUVar3 + -1;
  }
  if ((char)pUVar3[-1] < -0x40) {
    pUVar3 = pUVar3 + -1;
switchD_008563e2_caseD_2:
    bVar1 = pUVar3[-1];
    if (bVar1 < 0xc0) {
      bVar2 = *source;
      if (bVar2 == 0xf4) {
        bVar2 = 0xf4;
        if (bVar1 < 0x90) {
LAB_008563ea:
          return bVar2 < 0xf5;
        }
      }
      else if (bVar2 == 0xed) {
        bVar2 = 0xed;
        if (bVar1 < 0xa0) goto LAB_008563ea;
      }
      else if (bVar2 == 0xf0) {
        bVar2 = 0xf0;
        if (0x8f < bVar1) goto LAB_008563ea;
      }
      else if (bVar2 == 0xe0) {
        bVar2 = 0xe0;
        if (0x9f < bVar1) goto LAB_008563ea;
      }
      else if ((char)bVar1 < '\0') {
LAB_008563e6:
        if (-0x3f < (char)bVar2) goto LAB_008563ea;
      }
    }
  }
  return '\0';
}

Assistant:

static Boolean isLegalUTF8(const UTF8 *source, int length) {
    UTF8 a;
    const UTF8 *srcptr = source+length;
    switch (length) {
    default: return false;
	/* Everything else falls through when "true"... */
    case 4: if ((a = (*--srcptr)) < 0x80 || a > 0xBF) return false;
    case 3: if ((a = (*--srcptr)) < 0x80 || a > 0xBF) return false;
    case 2: if ((a = (*--srcptr)) > 0xBF) return false;

	switch (*source) {
	    /* no fall-through in this inner switch */
	    case 0xE0: if (a < 0xA0) return false; break;
	    case 0xED: if (a > 0x9F) return false; break;
	    case 0xF0: if (a < 0x90) return false; break;
	    case 0xF4: if (a > 0x8F) return false; break;
	    default:   if (a < 0x80) return false;
	}

    case 1: if (*source >= 0x80 && *source < 0xC2) return false;
    }
    if (*source > 0xF4) return false;
    return true;
}